

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockedpool.cpp
# Opt level: O3

size_t __thiscall PosixLockedPageAllocator::GetLimit(PosixLockedPageAllocator *this)

{
  int iVar1;
  long in_FS_OFFSET;
  rlimit rlim;
  rlimit local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = getrlimit(__RLIMIT_MEMLOCK,&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return -(ulong)(iVar1 != 0) | local_20.rlim_cur;
  }
  __stack_chk_fail();
}

Assistant:

size_t PosixLockedPageAllocator::GetLimit()
{
#ifdef RLIMIT_MEMLOCK
    struct rlimit rlim;
    if (getrlimit(RLIMIT_MEMLOCK, &rlim) == 0) {
        if (rlim.rlim_cur != RLIM_INFINITY) {
            return rlim.rlim_cur;
        }
    }
#endif
    return std::numeric_limits<size_t>::max();
}